

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QDirPrivate * __thiscall QDir::d_func(QDir *this)

{
  QDirPrivate *pQVar1;
  
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1 != (QDirPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
  }
  return (this->d_ptr).d.ptr;
}

Assistant:

QDirPrivate* QDir::d_func()
{
    return d_ptr.data();
}